

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

bool __thiscall
unodb::
olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::iterator::try_push_leaf(iterator *this,olc_node_ptr aleaf,read_critical_section *rcs)

{
  undefined1 local_40 [24];
  version_tag_type local_28;
  read_critical_section *local_20;
  read_critical_section *rcs_local;
  iterator *this_local;
  olc_node_ptr aleaf_local;
  
  local_40[8] = 0xff;
  local_40[9] = 0xff;
  local_40._0_8_ = aleaf.tagged_ptr;
  local_20 = rcs;
  rcs_local = (read_critical_section *)this;
  this_local = (iterator *)aleaf.tagged_ptr;
  detail::key_prefix_snapshot::key_prefix_snapshot((key_prefix_snapshot *)(local_40 + 0x10),0);
  local_28 = optimistic_lock::read_critical_section::get(local_20);
  std::
  stack<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::deque<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>_>
  ::push(&this->stack_,(value_type *)local_40);
  return true;
}

Assistant:

bool try_push_leaf(detail::olc_node_ptr aleaf,
                       const optimistic_lock::read_critical_section& rcs) {
      // The [key], [child_index] and [prefix] are ignored for a leaf.
      stack_.push({{aleaf,
                    static_cast<std::byte>(0xFFU),     // key_byte
                    static_cast<std::uint8_t>(0xFFU),  // child_index
                    detail::key_prefix_snapshot(0)},   // empty key_prefix
                   rcs.get()});
      return true;
    }